

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void deleteProcess(void)

{
  int iVar1;
  _List_node_base *p_Var2;
  size_t sVar3;
  list<MemBlock*,std::allocator<MemBlock*>> *plVar4;
  undefined1 **ppuVar5;
  undefined1 **ppuVar6;
  bool bVar7;
  _List_node_base **pp_Var8;
  list<MemBlock*,std::allocator<MemBlock*>> *plVar9;
  char *pcVar10;
  _List_node_base *p_Var11;
  _List_node_base *p_Var12;
  long lVar13;
  _List_node_base *p_Var14;
  long lVar15;
  long lVar16;
  list<MemBlock*,std::allocator<MemBlock*>> *plVar17;
  bool bVar18;
  list<MemBlock_*,_std::allocator<MemBlock_*>_> __carry;
  int pid;
  Process *process;
  _List_node_base local_678;
  _List_node_base *local_668;
  int local_65c;
  undefined1 **local_658;
  _List_node_base local_650;
  _List_node_base *local_640;
  _List_node_base local_638;
  _List_node_base *local_628;
  list<MemBlock*,std::allocator<MemBlock*>> local_620 [1512];
  list<MemBlock*,std::allocator<MemBlock*>> local_38 [8];
  
  local_65c = 0;
  pcVar10 = strtok((char *)0x0," ");
  if (pcVar10 == (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"have no enough args",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    return;
  }
  __isoc99_sscanf(pcVar10,"%d",&local_65c);
  local_640 = (_List_node_base *)0x0;
  if (processList_abi_cxx11_.super__List_base<Process_*,_std::allocator<Process_*>_>._M_impl._M_node
      .super__List_node_base._M_next == (_List_node_base *)&processList_abi_cxx11_) {
LAB_001027d7:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"no process was found with that pid!",0x23);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    return;
  }
  p_Var12 = (_List_node_base *)0x0;
  p_Var11 = processList_abi_cxx11_.super__List_base<Process_*,_std::allocator<Process_*>_>._M_impl.
            _M_node.super__List_node_base._M_next;
  do {
    p_Var14 = p_Var11[1]._M_next;
    if (*(int *)&p_Var14->_M_next == local_65c) {
      p_Var12 = p_Var14;
      local_640 = p_Var14;
    }
    p_Var11 = (((_List_base<Process_*,_std::allocator<Process_*>_> *)&p_Var11->_M_next)->_M_impl).
              _M_node.super__List_node_base._M_next;
  } while (p_Var11 != (_List_node_base *)&processList_abi_cxx11_);
  if (p_Var12 == (_List_node_base *)0x0) goto LAB_001027d7;
  std::__cxx11::list<Process_*,_std::allocator<Process_*>_>::remove
            (&processList_abi_cxx11_,(char *)&local_640);
  std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::remove
            (&usedMemBlockList_abi_cxx11_,(char *)&local_640[3]._M_prev);
  p_Var11 = local_640;
  p_Var12 = (_List_node_base *)operator_new(0x18);
  p_Var12[1]._M_next = p_Var11[3]._M_prev;
  std::__detail::_List_node_base::_M_hook(p_Var12);
  freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl.
  _M_node._M_size =
       freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl
       ._M_node._M_size + 1;
  if (freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl.
      _M_node.super__List_node_base._M_next == (_List_node_base *)&freeMemBlockList_abi_cxx11_) {
LAB_00102880:
    local_650._M_next = (_List_node_base *)&local_658;
    local_658 = (undefined1 **)&local_658;
    local_650._M_prev = (_List_node_base *)0x0;
    freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl.
    _M_node.super__List_node_base._M_prev = (_List_node_base *)&freeMemBlockList_abi_cxx11_;
    freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl.
    _M_node.super__List_node_base._M_next = (_List_node_base *)&freeMemBlockList_abi_cxx11_;
    freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl.
    _M_node._M_size = 0;
  }
  else {
    if ((freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
         _M_impl._M_node.super__List_node_base._M_next)->_M_next !=
        (_List_node_base *)&freeMemBlockList_abi_cxx11_) {
      local_678._M_next = &local_678;
      local_668 = (_List_node_base *)0x0;
      lVar13 = 0;
      do {
        lVar15 = (long)&local_638._M_next + lVar13;
        *(long *)((long)&local_638._M_prev + lVar13) = lVar15;
        *(long *)lVar15 = lVar15;
        *(undefined8 *)((long)&local_628 + lVar13) = 0;
        lVar13 = lVar13 + 0x18;
      } while (lVar13 != 0x600);
      lVar13 = 0;
      local_678._M_prev = local_678._M_next;
      do {
        lVar15 = lVar13;
        if ((freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
             _M_impl._M_node.super__List_node_base._M_next)->_M_next != local_678._M_next &&
            local_678._M_next !=
            freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
            _M_impl._M_node.super__List_node_base._M_next) {
          std::__detail::_List_node_base::_M_transfer
                    (local_678._M_next,
                     freeMemBlockList_abi_cxx11_.
                     super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl._M_node.
                     super__List_node_base._M_next);
          local_668 = (_List_node_base *)((long)&local_668->_M_next + 1);
          freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
          _M_impl._M_node._M_size =
               freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>
               ._M_impl._M_node._M_size - 1;
        }
        p_Var11 = (_List_node_base *)((long)&local_638._M_next + lVar15);
        lVar13 = 0x18;
        if (lVar15 == 0) {
          bVar7 = true;
          p_Var12 = &local_638;
        }
        else {
          p_Var14 = &local_638;
          lVar16 = lVar15;
          do {
            bVar18 = p_Var14 == p_Var14->_M_next;
            bVar7 = !bVar18;
            if (bVar18) {
              lVar13 = 0;
              p_Var12 = p_Var14;
              break;
            }
            std::__cxx11::list<MemBlock*,std::allocator<MemBlock*>>::merge<deleteProcess()::__0>
                      ((list<MemBlock*,std::allocator<MemBlock*>> *)p_Var14,&local_678);
            std::__detail::_List_node_base::swap(&local_678,p_Var14);
            p_Var2 = p_Var14[1]._M_next;
            p_Var14[1]._M_next = local_668;
            p_Var14 = (_List_node_base *)&p_Var14[1]._M_prev;
            lVar16 = lVar16 + -0x18;
            p_Var12 = p_Var11;
            local_668 = p_Var2;
          } while (lVar16 != 0);
        }
        std::__detail::_List_node_base::swap(&local_678,p_Var12);
        p_Var14 = p_Var12[1]._M_next;
        p_Var12[1]._M_next = local_668;
        lVar13 = lVar13 + lVar15;
        local_668 = p_Var14;
      } while (freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>
               ._M_impl._M_node.super__List_node_base._M_next !=
               (_List_node_base *)&freeMemBlockList_abi_cxx11_);
      if (lVar13 != 0x18) {
        plVar17 = local_620;
        do {
          std::__cxx11::list<MemBlock*,std::allocator<MemBlock*>>::merge<deleteProcess()::__0>
                    (plVar17,plVar17 + -0x18);
          plVar17 = plVar17 + 0x18;
        } while (plVar17 !=
                 (list<MemBlock*,std::allocator<MemBlock*>> *)((long)&local_638._M_next + lVar13));
      }
      plVar17 = local_620 + 0x5e8;
      pp_Var8 = &local_628;
      if (!bVar7) {
        p_Var11 = (_List_node_base *)((long)&local_650 + lVar15);
        pp_Var8 = &local_640;
      }
      std::__detail::_List_node_base::swap((_List_node_base *)&freeMemBlockList_abi_cxx11_,p_Var11);
      sVar3 = *(size_t *)((long)pp_Var8 + lVar15);
      *(size_t *)((long)pp_Var8 + lVar15) =
           freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
           _M_impl._M_node._M_size;
      freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl.
      _M_node._M_size = sVar3;
      do {
        plVar9 = plVar17 + -0x18;
        plVar17 = plVar17 + -0x18;
        plVar9 = *(list<MemBlock*,std::allocator<MemBlock*>> **)plVar9;
        while (plVar9 != plVar17) {
          plVar4 = *(list<MemBlock*,std::allocator<MemBlock*>> **)plVar9;
          operator_delete(plVar9);
          plVar9 = plVar4;
        }
        p_Var11 = local_678._M_next;
      } while ((_List_node_base *)plVar17 != &local_638);
      while (p_Var11 != &local_678) {
        p_Var12 = p_Var11->_M_next;
        operator_delete(p_Var11);
        p_Var11 = p_Var12;
      }
      if (freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
          _M_impl._M_node.super__List_node_base._M_next ==
          (_List_node_base *)&freeMemBlockList_abi_cxx11_) goto LAB_00102880;
    }
    local_650._M_prev = (_List_node_base *)0x0;
    local_658 = (undefined1 **)&local_658;
    local_650._M_next = (_List_node_base *)&local_658;
    do {
      p_Var12 = freeMemBlockList_abi_cxx11_.
                super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl._M_node.
                super__List_node_base._M_next;
      p_Var11 = freeMemBlockList_abi_cxx11_.
                super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl._M_node.
                super__List_node_base._M_next[1]._M_next;
      freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl.
      _M_node._M_size =
           freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
           _M_impl._M_node._M_size - 1;
      std::__detail::_List_node_base::_M_unhook();
      while (operator_delete(p_Var12),
            p_Var14 = freeMemBlockList_abi_cxx11_.
                      super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl._M_node.
                      super__List_node_base._M_next,
            freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
            _M_impl._M_node.super__List_node_base._M_next !=
            (_List_node_base *)&freeMemBlockList_abi_cxx11_) {
        p_Var12 = freeMemBlockList_abi_cxx11_.
                  super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl._M_node.
                  super__List_node_base._M_next[1]._M_next;
        freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
        _M_impl._M_node._M_size =
             freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
             _M_impl._M_node._M_size - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var14);
        iVar1 = *(int *)((long)&p_Var11->_M_next + 4);
        if (*(int *)&p_Var11->_M_next + iVar1 != *(int *)&p_Var12->_M_next) {
          p_Var14 = (_List_node_base *)operator_new(0x18);
          p_Var14[1]._M_next = p_Var12;
          std::__detail::_List_node_base::_M_hook(p_Var14);
          local_650._M_prev = (_List_node_base *)((long)local_650._M_prev + 1);
          break;
        }
        *(int *)((long)&p_Var11->_M_next + 4) = iVar1 + *(int *)((long)&p_Var12->_M_next + 4);
      }
      p_Var12 = (_List_node_base *)operator_new(0x18);
      p_Var12[1]._M_next = p_Var11;
      std::__detail::_List_node_base::_M_hook(p_Var12);
      local_650._M_prev = (_List_node_base *)((long)local_650._M_prev + 1);
    } while (freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
             _M_impl._M_node.super__List_node_base._M_next !=
             (_List_node_base *)&freeMemBlockList_abi_cxx11_);
    freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl.
    _M_node.super__List_node_base._M_prev = (_List_node_base *)&freeMemBlockList_abi_cxx11_;
    freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl.
    _M_node._M_size = 0;
    for (ppuVar5 = local_658; (undefined1 ***)ppuVar5 != &local_658;
        ppuVar5 = (undefined1 **)*ppuVar5) {
      p_Var11 = (_List_node_base *)ppuVar5[2];
      p_Var12 = (_List_node_base *)operator_new(0x18);
      p_Var12[1]._M_next = p_Var11;
      std::__detail::_List_node_base::_M_hook(p_Var12);
      freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl.
      _M_node._M_size =
           freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
           _M_impl._M_node._M_size + 1;
    }
  }
  operator_delete(local_640);
  if ((freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl
       ._M_node.super__List_node_base._M_next != (_List_node_base *)&freeMemBlockList_abi_cxx11_) &&
     ((freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl
       ._M_node.super__List_node_base._M_next)->_M_next !=
      (_List_node_base *)&freeMemBlockList_abi_cxx11_)) {
    local_678._M_next = &local_678;
    local_668 = (_List_node_base *)0x0;
    lVar13 = 0;
    do {
      lVar15 = (long)&local_638._M_next + lVar13;
      *(long *)((long)&local_638._M_prev + lVar13) = lVar15;
      *(long *)lVar15 = lVar15;
      *(undefined8 *)((long)&local_628 + lVar13) = 0;
      lVar13 = lVar13 + 0x18;
    } while (lVar13 != 0x600);
    lVar13 = 0;
    local_678._M_prev = local_678._M_next;
    do {
      lVar15 = lVar13;
      if ((freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
           _M_impl._M_node.super__List_node_base._M_next)->_M_next != local_678._M_next &&
          local_678._M_next !=
          freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
          _M_impl._M_node.super__List_node_base._M_next) {
        std::__detail::_List_node_base::_M_transfer
                  (local_678._M_next,
                   freeMemBlockList_abi_cxx11_.
                   super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl._M_node.
                   super__List_node_base._M_next);
        local_668 = (_List_node_base *)((long)&local_668->_M_next + 1);
        freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
        _M_impl._M_node._M_size =
             freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
             _M_impl._M_node._M_size - 1;
      }
      p_Var11 = (_List_node_base *)((long)&local_638._M_next + lVar15);
      lVar13 = 0x18;
      if (lVar15 == 0) {
        bVar7 = true;
        p_Var12 = &local_638;
      }
      else {
        p_Var14 = &local_638;
        lVar16 = lVar15;
        do {
          bVar18 = p_Var14 == p_Var14->_M_next;
          bVar7 = !bVar18;
          if (bVar18) {
            lVar13 = 0;
            p_Var12 = p_Var14;
            break;
          }
          std::__cxx11::list<MemBlock*,std::allocator<MemBlock*>>::merge<deleteProcess()::__1>
                    ((list<MemBlock*,std::allocator<MemBlock*>> *)p_Var14,&local_678);
          std::__detail::_List_node_base::swap(&local_678,p_Var14);
          p_Var2 = p_Var14[1]._M_next;
          p_Var14[1]._M_next = local_668;
          p_Var14 = (_List_node_base *)&p_Var14[1]._M_prev;
          lVar16 = lVar16 + -0x18;
          p_Var12 = p_Var11;
          local_668 = p_Var2;
        } while (lVar16 != 0);
      }
      std::__detail::_List_node_base::swap(&local_678,p_Var12);
      p_Var14 = p_Var12[1]._M_next;
      p_Var12[1]._M_next = local_668;
      lVar13 = lVar13 + lVar15;
      local_668 = p_Var14;
    } while (freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
             _M_impl._M_node.super__List_node_base._M_next !=
             (_List_node_base *)&freeMemBlockList_abi_cxx11_);
    if (lVar13 != 0x18) {
      plVar17 = local_620;
      do {
        std::__cxx11::list<MemBlock*,std::allocator<MemBlock*>>::merge<deleteProcess()::__1>
                  (plVar17,plVar17 + -0x18);
        plVar17 = plVar17 + 0x18;
      } while (plVar17 !=
               (list<MemBlock*,std::allocator<MemBlock*>> *)((long)&local_638._M_next + lVar13));
    }
    plVar17 = local_620 + 0x5e8;
    pp_Var8 = &local_628;
    if (!bVar7) {
      p_Var11 = (_List_node_base *)((long)&local_650 + lVar15);
      pp_Var8 = &local_640;
    }
    std::__detail::_List_node_base::swap((_List_node_base *)&freeMemBlockList_abi_cxx11_,p_Var11);
    sVar3 = *(size_t *)((long)pp_Var8 + lVar15);
    *(size_t *)((long)pp_Var8 + lVar15) =
         freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
         _M_impl._M_node._M_size;
    freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl.
    _M_node._M_size = sVar3;
    do {
      plVar9 = plVar17 + -0x18;
      plVar17 = plVar17 + -0x18;
      plVar9 = *(list<MemBlock*,std::allocator<MemBlock*>> **)plVar9;
      while (plVar9 != plVar17) {
        plVar4 = *(list<MemBlock*,std::allocator<MemBlock*>> **)plVar9;
        operator_delete(plVar9);
        plVar9 = plVar4;
      }
      p_Var11 = local_678._M_next;
    } while ((_List_node_base *)plVar17 != &local_638);
    while (p_Var11 != &local_678) {
      p_Var12 = p_Var11->_M_next;
      operator_delete(p_Var11);
      p_Var11 = p_Var12;
    }
  }
  ppuVar5 = local_658;
  while ((undefined1 ***)ppuVar5 != &local_658) {
    ppuVar6 = (undefined1 **)*ppuVar5;
    operator_delete(ppuVar5);
    ppuVar5 = ppuVar6;
  }
  return;
}

Assistant:

void deleteProcess() {
    // 获取参数
    int pid = 0;
    char *p = strtok(NULL, " ");
    if (!p) {
        cout << "have no enough args" << endl;
        return;
    }
    sscanf(p, "%d", &pid);
    // 在链表中寻找具有该pid的进程
    Process *process = nullptr;
    for (Process *i : processList)
        if (i->pid == pid) process = i;
    // 如果找到了
    if (process) {
        // 将process从链表中移出
        processList.remove(process);
        // 将process用过的内存块从使用过的内存链表中移出并且加入空闲内存链表
        usedMemBlockList.remove(process->memBlock);
        freeMemBlockList.push_back(process->memBlock);
        // 将空闲内存链表按照起始地址排序
        freeMemBlockList.sort([=](MemBlock *a, MemBlock *b) -> bool {
            return a->start < b->start;
        });
        // 看这些链表中有没有可以合并的项
        list<MemBlock *> temp;
        while (!freeMemBlockList.empty()) {
            MemBlock *block = freeMemBlockList.front();
            freeMemBlockList.pop_front();
            while (!freeMemBlockList.empty()) {
                MemBlock *another = freeMemBlockList.front();
                freeMemBlockList.pop_front();
                if (block->start + block->length == another->start) {
                    block->length = block->length + another->length;
                    delete another;
                } else {
                    temp.push_front(another);
                    break;
                }
            }
            temp.push_back(block);
        }
        freeMemBlockList.clear();
        for (MemBlock *i : temp) freeMemBlockList.push_back(i);
        // 删除process
        delete process;
        // 将空闲内存链表按照起始地址排序
        freeMemBlockList.sort([=](MemBlock *a, MemBlock *b) -> bool {
            return a->start < b->start;
        });
    } else cout << "no process was found with that pid!" << endl;
}